

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

part_mask_t duckdb::DatePart::StructOperator::GetMask(part_codes_t *part_codes)

{
  part_mask_t pVar1;
  InternalException *this;
  pointer pDVar2;
  allocator local_39;
  string local_38;
  
  pVar1 = 0;
  for (pDVar2 = (part_codes->
                super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>)
                .
                super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 != (part_codes->
                super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>)
                .
                super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_finish; pDVar2 = pDVar2 + 1) {
    switch(*pDVar2) {
    case BEGIN_BIGINT:
    case MONTH:
    case DAY:
    case DECADE:
    case CENTURY:
    case MILLENNIUM:
    case QUARTER:
    case ERA:
      pVar1 = pVar1 | 1;
      break;
    case MICROSECONDS:
    case MILLISECONDS:
    case SECOND:
    case MINUTE:
    case HOUR:
      pVar1 = pVar1 | 0x10;
      break;
    case DOW:
    case ISODOW:
      pVar1 = pVar1 | 2;
      break;
    case WEEK:
    case ISOYEAR:
    case YEARWEEK:
      pVar1 = pVar1 | 0x40;
      break;
    case DOY:
      pVar1 = pVar1 | 4;
      break;
    case TIMEZONE:
    case TIMEZONE_HOUR:
    case TIMEZONE_MINUTE:
      pVar1 = pVar1 | 0x20;
      break;
    case BEGIN_DOUBLE:
      pVar1 = pVar1 | 8;
      break;
    case JULIAN_DAY:
      pVar1 = pVar1 | 0x80;
      break;
    case BEGIN_INVALID:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Invalid DatePartSpecifier for STRUCT mask!",&local_39);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return pVar1;
}

Assistant:

int64_t DatePart::EpochNanosecondsOperator::Operation(timestamp_t input) {
	D_ASSERT(Timestamp::IsFinite(input));
	return Timestamp::GetEpochNanoSeconds(input);
}